

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afloader.c
# Opt level: O0

FT_Error af_loader_embolden_glyph_in_slot
                   (AF_Loader loader,FT_Face face,AF_StyleMetrics_conflict style_metrics)

{
  FT_Int32 FVar1;
  FT_Fixed FVar2;
  FT_Long FVar3;
  bool bVar4;
  FT_Fixed darken_y;
  FT_Fixed darken_by_font_units_y;
  FT_Fixed darken_x;
  FT_Fixed darken_by_font_units_x;
  FT_Matrix scale_down_matrix;
  FT_Fixed em_size;
  AF_WritingSystem_GetStdWidthsFunc p_Stack_58;
  FT_Bool size_changed;
  FT_Pos stdHW;
  FT_Pos stdVW;
  FT_Size_Metrics *size_metrics;
  AF_WritingSystemClass writing_system_class;
  AF_FaceGlobals globals;
  FT_GlyphSlot slot;
  AF_StyleMetrics_conflict pAStack_20;
  FT_Error error;
  AF_StyleMetrics_conflict style_metrics_local;
  FT_Face face_local;
  AF_Loader loader_local;
  
  slot._4_4_ = 0;
  globals = (AF_FaceGlobals)face->glyph;
  writing_system_class = (AF_WritingSystemClass)loader->globals;
  stdVW = (FT_Pos)&face->size->internal->autohint_metrics;
  stdHW = 0;
  p_Stack_58 = (AF_WritingSystem_GetStdWidthsFunc)0x0;
  bVar4 = ((FT_Size_Metrics *)stdVW)->x_ppem !=
          ((AF_FaceGlobals)writing_system_class)->stem_darkening_for_ppem;
  scale_down_matrix.yy = (ulong)face->units_per_EM << 0x10;
  darken_by_font_units_x = 0x10000;
  scale_down_matrix.xx = 0;
  scale_down_matrix.xy = 0;
  scale_down_matrix.yx = 0x10000;
  if (face->units_per_EM == 0) {
    slot._4_4_ = 0xb9;
  }
  else {
    size_metrics = (FT_Size_Metrics *)
                   af_writing_system_classes[style_metrics->style_class->writing_system];
    if (((AF_WritingSystemClass)size_metrics)->style_metrics_getstdw ==
        (AF_WritingSystem_GetStdWidthsFunc)0x0) {
      slot._4_4_ = 7;
    }
    else {
      pAStack_20 = style_metrics;
      style_metrics_local = (AF_StyleMetrics_conflict)face;
      face_local = (FT_Face)loader;
      (*((AF_WritingSystemClass)size_metrics)->style_metrics_getstdw)
                (style_metrics,(FT_Pos *)&stack0xffffffffffffffa8,&stdHW);
      if ((bVar4) ||
         ((0 < stdHW &&
          ((AF_WritingSystem_DoneMetricsFunc)stdHW != writing_system_class[0xb].style_metrics_done))
         )) {
        FVar2 = af_loader_compute_darkening
                          ((AF_Loader)face_local,(FT_Face)style_metrics_local,stdHW);
        FVar1 = FT_MulFix_x86_64((FT_Int32)FVar2,(FT_Int32)*(undefined8 *)(stdVW + 8));
        writing_system_class[0xb].style_metrics_done = (AF_WritingSystem_DoneMetricsFunc)stdHW;
        *(undefined2 *)&writing_system_class[0xb].style_metrics_scale = *(undefined2 *)stdVW;
        writing_system_class[0xb].style_hints_init =
             (AF_WritingSystem_InitHintsFunc)(long)(short)((uint)(FVar1 + 0x8000) >> 0x10);
      }
      if ((bVar4) ||
         ((0 < (long)p_Stack_58 && (p_Stack_58 != writing_system_class[0xb].style_metrics_getstdw)))
         ) {
        FVar2 = af_loader_compute_darkening
                          ((AF_Loader)face_local,(FT_Face)style_metrics_local,(FT_Pos)p_Stack_58);
        FVar1 = FT_MulFix_x86_64((FT_Int32)FVar2,(FT_Int32)*(undefined8 *)(stdVW + 0x10));
        writing_system_class[0xb].style_metrics_getstdw = p_Stack_58;
        *(undefined2 *)&writing_system_class[0xb].style_metrics_scale = *(undefined2 *)stdVW;
        writing_system_class[0xb].style_hints_apply =
             (AF_WritingSystem_ApplyHintsFunc)(long)(short)((uint)(FVar1 + 0x8000) >> 0x10);
        FVar3 = FT_DivFix(scale_down_matrix.yy - (FVar2 + 0x80000),scale_down_matrix.yy);
        *(FT_Long *)(writing_system_class + 0xc) = FVar3;
      }
      FT_Outline_EmboldenXY
                ((FT_Outline *)(globals->metrics + 0x15),
                 (FT_Pos)writing_system_class[0xb].style_hints_init,
                 (FT_Pos)writing_system_class[0xb].style_hints_apply);
      scale_down_matrix.yx = *(FT_Fixed *)(writing_system_class + 0xc);
      FT_Outline_Transform
                ((FT_Outline *)(globals->metrics + 0x15),(FT_Matrix *)&darken_by_font_units_x);
    }
  }
  return slot._4_4_;
}

Assistant:

static FT_Error
  af_loader_embolden_glyph_in_slot( AF_Loader        loader,
                                    FT_Face          face,
                                    AF_StyleMetrics  style_metrics )
  {
    FT_Error  error = FT_Err_Ok;

    FT_GlyphSlot           slot    = face->glyph;
    AF_FaceGlobals         globals = loader->globals;
    AF_WritingSystemClass  writing_system_class;

    FT_Size_Metrics*  size_metrics = &face->size->internal->autohint_metrics;

    FT_Pos  stdVW = 0;
    FT_Pos  stdHW = 0;

    FT_Bool  size_changed = size_metrics->x_ppem !=
                              globals->stem_darkening_for_ppem;

    FT_Fixed  em_size  = af_intToFixed( face->units_per_EM );

    FT_Matrix  scale_down_matrix = { 0x10000L, 0, 0, 0x10000L };


    /* Skip stem darkening for broken fonts. */
    if ( !face->units_per_EM )
    {
      error = FT_ERR( Corrupted_Font_Header );
      goto Exit;
    }

    /*
     * We depend on the writing system (script analyzers) to supply
     * standard widths for the script of the glyph we are looking at.  If
     * it can't deliver, stem darkening is disabled.
     */
    writing_system_class =
      af_writing_system_classes[style_metrics->style_class->writing_system];

    if ( writing_system_class->style_metrics_getstdw )
      writing_system_class->style_metrics_getstdw( style_metrics,
                                                   &stdHW,
                                                   &stdVW );
    else
    {
      error = FT_ERR( Unimplemented_Feature );
      goto Exit;
    }

    if ( size_changed                                               ||
         ( stdVW > 0 && stdVW != globals->standard_vertical_width ) )
    {
      FT_Fixed  darken_by_font_units_x, darken_x;


      darken_by_font_units_x =
         af_loader_compute_darkening( loader,
                                      face,
                                      stdVW ) ;
      darken_x = FT_MulFix( darken_by_font_units_x,
                            size_metrics->x_scale );

      globals->standard_vertical_width = stdVW;
      globals->stem_darkening_for_ppem = size_metrics->x_ppem;
      globals->darken_x                = af_fixedToInt( darken_x );
    }

    if ( size_changed                                                 ||
         ( stdHW > 0 && stdHW != globals->standard_horizontal_width ) )
    {
      FT_Fixed  darken_by_font_units_y, darken_y;


      darken_by_font_units_y =
         af_loader_compute_darkening( loader,
                                      face,
                                      stdHW ) ;
      darken_y = FT_MulFix( darken_by_font_units_y,
                            size_metrics->y_scale );

      globals->standard_horizontal_width = stdHW;
      globals->stem_darkening_for_ppem   = size_metrics->x_ppem;
      globals->darken_y                  = af_fixedToInt( darken_y );

      /*
       * Scale outlines down on the Y-axis to keep them inside their blue
       * zones.  The stronger the emboldening, the stronger the downscaling
       * (plus heuristical padding to prevent outlines still falling out
       * their zones due to rounding).
       *
       * Reason: `FT_Outline_Embolden' works by shifting the rightmost
       * points of stems farther to the right, and topmost points farther
       * up.  This positions points on the Y-axis outside their
       * pre-computed blue zones and leads to distortion when applying the
       * hints in the code further below.  Code outside this emboldening
       * block doesn't know we are presenting it with modified outlines the
       * analyzer didn't see!
       *
       * An unfortunate side effect of downscaling is that the emboldening
       * effect is slightly decreased.  The loss becomes more pronounced
       * versus the CFF driver at smaller sizes, e.g., at 9ppem and below.
       */
      globals->scale_down_factor =
        FT_DivFix( em_size - ( darken_by_font_units_y + af_intToFixed( 8 ) ),
                   em_size );
    }

    FT_Outline_EmboldenXY( &slot->outline,
                           globals->darken_x,
                           globals->darken_y );

    scale_down_matrix.yy = globals->scale_down_factor;
    FT_Outline_Transform( &slot->outline, &scale_down_matrix );

  Exit:
    return error;
  }